

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  TestingPortal *pTVar2;
  ulong uVar3;
  undefined4 *puVar4;
  char *pcVar5;
  undefined1 local_38 [4];
  int err_code;
  Cleanup<std::function<void_()>_> fork_cleanup;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  fork_cleanup.callback_._M_invoker = (_Invoker_type)argv;
  argv_local._0_4_ = argc;
  HandleVariableRuns(argc,argv);
  pTVar2 = tcmalloc::TestingPortal::Get();
  uVar3 = (**(code **)(*(long *)pTVar2 + 8))();
  if ((uVar3 & 1) != 0) {
    pTVar2 = tcmalloc::TestingPortal::Get();
    puVar4 = (undefined4 *)(**(code **)(*(long *)pTVar2 + 0x38))();
    *puVar4 = 0;
  }
  pcVar5 = getenv("DONT_TEST_SYSTEM_RELEASE");
  if (pcVar5 == (char *)0x0) {
    pTVar2 = tcmalloc::TestingPortal::Get();
    uVar3 = (*(code *)**(undefined8 **)pTVar2)();
    if ((uVar3 & 1) == 0) {
      syscall(1,2,"Check failed: TestingPortal::Get()->HaveSystemRelease()\n",0x38);
      abort();
    }
  }
  testing::InitGoogleTest((int *)&argv_local,(char **)fork_cleanup.callback_._M_invoker);
  fork_torture::setup_fork_testing
            ((Cleanup<std::function<void_()>_> *)local_38,(int *)&argv_local,
             (char ***)&fork_cleanup.callback_._M_invoker);
  iVar1 = RUN_ALL_TESTS();
  if (iVar1 != 0) {
    argv_local._4_4_ = iVar1;
  }
  tcmalloc::Cleanup<std::function<void_()>_>::~Cleanup((Cleanup<std::function<void_()>_> *)local_38)
  ;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  HandleVariableRuns(argc, argv);

  if (TestingPortal::Get()->IsDebuggingMalloc()) {
    // return freed blocks to tcmalloc immediately
    TestingPortal::Get()->GetMaxFreeQueueSize() = 0;
  }

#if defined(__linux) || defined(_WIN32)
  // We know that Linux and Windows have functional memory releasing
  // support. So don't let us degrade on that.
  if (!getenv("DONT_TEST_SYSTEM_RELEASE")) {
    CHECK(TestingPortal::Get()->HaveSystemRelease());
  }
#endif

  testing::InitGoogleTest(&argc, argv);

  auto fork_cleanup = setup_fork_testing(&argc, &argv);
  (void)fork_cleanup;

  int err_code = RUN_ALL_TESTS();
  if (err_code) {
    return err_code;
  }
}